

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateSequence(ExpressionEvalContext *ctx,ExprSequence *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  ExprBase **ppEVar6;
  ExprBase *pEVar7;
  StackFrame **ppSVar8;
  undefined4 extraout_var_00;
  uint i;
  uint index;
  
  bVar4 = AddInstruction(ctx);
  if (bVar4) {
    pAVar1 = ctx->ctx->allocator;
    iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = pSVar2;
    pEVar7->type = pTVar3;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223678;
    index = 0;
    do {
      if ((expression->expressions).count <= index) {
        if (((ctx->stackFrames).count != 0) &&
           (ppSVar8 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
           (*ppSVar8)->targetYield != 0)) {
          pAVar1 = ctx->ctx->allocator;
          iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
          pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar5);
          pSVar2 = (expression->super_ExprBase).source;
          pTVar3 = ctx->ctx->typeVoid;
          pEVar7->typeID = 2;
          pEVar7->source = pSVar2;
          pEVar7->type = pTVar3;
          pEVar7->next = (ExprBase *)0x0;
          pEVar7->listed = false;
          pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223678;
          return pEVar7;
        }
        pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
        return pEVar7;
      }
      ppEVar6 = SmallArray<ExprBase_*,_4U>::operator[](&expression->expressions,index);
      pEVar7 = Evaluate(ctx,*ppEVar6);
      index = index + 1;
    } while (pEVar7 != (ExprBase *)0x0);
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateSequence(ExpressionEvalContext &ctx, ExprSequence *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *result = new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	for(unsigned i = 0; i < expression->expressions.size(); i++)
	{
		result = Evaluate(ctx, expression->expressions[i]);

		if(!result)
			return NULL;
	}

	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	return CheckType(expression, result);
}